

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::ReadMotorConfig(AmpIO *this,uint index,uint32_t *cfg)

{
  BasePort *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  
  uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar3 < 8) {
    bVar2 = false;
  }
  else {
    uVar3 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar3 == 0x64524131) {
      *cfg = 0x3000000;
      bVar2 = true;
    }
    else {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      bVar2 = false;
      if ((pBVar1 != (BasePort *)0x0) && (index < this->NumMotors)) {
        iVar4 = (*pBVar1->_vptr_BasePort[0x23])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                           (ulong)(index * 0x10 + 0x1b),cfg);
        return SUB41(iVar4,0);
      }
    }
  }
  return bVar2;
}

Assistant:

bool AmpIO::ReadMotorConfig(unsigned int index, uint32_t &cfg) const
{
    bool ret = false;
    if (GetFirmwareVersion() < 8) return ret;

    if (GetHardwareVersion() == dRA1_String) {
        // dRAC supports either voltage or current control
        cfg = MCFG_VOLTAGE_CONTROL | MCFG_CURRENT_CONTROL;
        ret = true;
    }
    else if (port && (index < NumMotors)) {
        unsigned int channel = (index+1) << 4;
        ret = port->ReadQuadlet(BoardId, channel | MOTOR_CONFIG_REG, cfg);
    }
    return ret;
}